

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

DataSegment * __thiscall wabt::Module::GetDataSegment(Module *this,Var *var)

{
  pointer ppDVar1;
  Index IVar2;
  DataSegment *pDVar3;
  
  IVar2 = BindingHash::FindIndex(&this->data_segment_bindings,var);
  ppDVar1 = (this->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)IVar2 <
      (ulong)((long)(this->data_segments).
                    super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3)) {
    pDVar3 = ppDVar1[IVar2];
  }
  else {
    pDVar3 = (DataSegment *)0x0;
  }
  return pDVar3;
}

Assistant:

const DataSegment* Module::GetDataSegment(const Var& var) const {
  return const_cast<Module*>(this)->GetDataSegment(var);
}